

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf.c
# Opt level: O1

int coda_netcdf_close(coda_product *product)

{
  if (product->filename != (char *)0x0) {
    free(product->filename);
  }
  if (product->root_type != (coda_dynamic_type *)0x0) {
    coda_dynamic_type_delete(product->root_type);
  }
  if (product->mem_ptr != (uint8_t *)0x0) {
    free(product->mem_ptr);
  }
  if ((coda_product *)product[1].filename != (coda_product *)0x0) {
    coda_bin_close((coda_product *)product[1].filename);
  }
  free(product);
  return 0;
}

Assistant:

int coda_netcdf_close(coda_product *product)
{
    coda_netcdf_product *product_file = (coda_netcdf_product *)product;

    if (product_file->filename != NULL)
    {
        free(product_file->filename);
    }
    if (product_file->root_type != NULL)
    {
        coda_dynamic_type_delete(product_file->root_type);
    }
    if (product_file->mem_ptr != NULL)
    {
        free(product_file->mem_ptr);
    }
    if (product_file->raw_product != NULL)
    {
        coda_bin_close((coda_product *)product_file->raw_product);
    }

    free(product_file);

    return 0;
}